

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O1

void __thiscall HEkkDualRow::choosePossible(HEkkDualRow *this)

{
  int iVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  int8_t *piVar7;
  double *pdVar8;
  pointer pdVar9;
  pointer ppVar10;
  long lVar11;
  HighsInt HVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar4 = (this->ekk_instance_->info_).update_count;
  if (iVar4 < 10) {
    dVar14 = 1e-09;
  }
  else {
    dVar14 = *(double *)(&DAT_003dced0 + (ulong)(iVar4 < 0x14) * 8);
  }
  dVar2 = (this->ekk_instance_->options_->super_HighsOptionsStruct).dual_feasibility_tolerance;
  this->workTheta = INFINITY;
  this->workCount = 0;
  iVar4 = this->packCount;
  if (0 < (long)iVar4) {
    dVar17 = this->workTheta;
    HVar12 = this->workCount;
    piVar6 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = this->workMove;
    pdVar8 = this->workDual;
    pdVar9 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar10 = (this->workData).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    uVar13 = -(ulong)(this->workDelta < 0.0);
    do {
      iVar5 = piVar6[lVar11];
      cVar3 = piVar7[iVar5];
      dVar15 = pdVar9[lVar11];
      dVar15 = (double)(~uVar13 & (ulong)dVar15 | (ulong)-dVar15 & uVar13) * (double)(int)cVar3;
      if (dVar14 < dVar15) {
        iVar1 = HVar12 + 1;
        this->workCount = iVar1;
        ppVar10[HVar12].first = iVar5;
        ppVar10[HVar12].second = dVar15;
        dVar16 = (double)(int)cVar3 * pdVar8[iVar5] + dVar2;
        HVar12 = iVar1;
        if (dVar16 < dVar15 * dVar17) {
          dVar17 = dVar16 / dVar15;
          this->workTheta = dVar17;
        }
      }
      lVar11 = lVar11 + 1;
    } while (iVar4 != lVar11);
  }
  return;
}

Assistant:

void HEkkDualRow::choosePossible() {
  /**
   * Determine the possible variables - candidates for CHUZC
   * TODO: Check with Qi what this is doing
   */
  const double Ta = ekk_instance_.info_.update_count < 10   ? 1e-9
                    : ekk_instance_.info_.update_count < 20 ? 3e-8
                                                            : 1e-6;
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  const HighsInt move_out = workDelta < 0 ? -1 : 1;
  workTheta = kHighsInf;
  workCount = 0;

  for (HighsInt i = 0; i < packCount; i++) {
    const HighsInt iCol = packIndex[i];
    const HighsInt move = workMove[iCol];
    const double alpha = packValue[i] * move_out * move;
    if (alpha > Ta) {
      workData[workCount++] = make_pair(iCol, alpha);
      const double relax = workDual[iCol] * move + Td;
      if (workTheta * alpha > relax) workTheta = relax / alpha;
    }
  }
}